

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

vector<WorldPath_*,_std::allocator<WorldPath_*>_> * __thiscall
WorldShuffler::build_weighted_blocked_paths_list
          (vector<WorldPath_*,_std::allocator<WorldPath_*>_> *__return_storage_ptr__,
          WorldShuffler *this)

{
  size_t *this_00;
  int iVar1;
  pointer this_01;
  bool bVar2;
  uint16_t uVar3;
  reference ppWVar4;
  reference ppIVar5;
  size_type sVar6;
  mapped_type_conflict2 *pmVar7;
  reference this_02;
  WorldNode *pWVar8;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  Json *local_130;
  Json *debug_log;
  type_conflict3 *ptStack_120;
  int i;
  type_conflict3 *quantity_to_place;
  type *item_id;
  _Self local_108;
  iterator __end2_1;
  iterator __begin2_1;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  *__range2_1;
  bool can_place_all_items;
  Item *pIStack_e8;
  Item *item;
  iterator __end2;
  iterator __begin2;
  vector<Item_*,_std::allocator<Item_*>_> *__range2;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  quantities_to_place;
  vector<Item_*,_std::allocator<Item_*>_> items_to_place;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> local_70;
  WorldPath *local_58;
  WorldPath *path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *__range1;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> weighted_blocked_paths;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *blocked_paths;
  WorldShuffler *this_local;
  
  weighted_blocked_paths.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)WorldSolver::blocked_paths(&this->_solver);
  std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::vector
            ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)&__range1);
  this_01 = weighted_blocked_paths.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::begin
                     ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)
                      weighted_blocked_paths.
                      super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  path = (WorldPath *)
         std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::end
                   ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)this_01);
  do {
    bVar2 = __gnu_cxx::
            operator==<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
                      (&__end1,(__normal_iterator<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
                                *)&path);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      vectools::shuffle<WorldPath*>
                ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)&__range1,&this->_rng);
      std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::vector
                (__return_storage_ptr__,
                 (vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)&__range1);
      std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::~vector
                ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)&__range1);
      return __return_storage_ptr__;
    }
    ppWVar4 = __gnu_cxx::
              __normal_iterator<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
              ::operator*(&__end1);
    local_58 = *ppWVar4;
    WorldSolver::missing_nodes_to_take_path(&local_70,&this->_solver,local_58);
    bVar2 = std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::empty(&local_70);
    std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::~vector(&local_70);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      WorldSolver::missing_items_to_take_path
                ((vector<Item_*,_std::allocator<Item_*>_> *)
                 &quantities_to_place._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &this->_solver,local_58);
      std::
      map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
      ::map((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
             *)&__range2);
      this_00 = &quantities_to_place._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end2 = std::vector<Item_*,_std::allocator<Item_*>_>::begin
                         ((vector<Item_*,_std::allocator<Item_*>_> *)this_00);
      item = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                               ((vector<Item_*,_std::allocator<Item_*>_> *)this_00);
      while (bVar2 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                               (&__end2,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                         *)&item), ((bVar2 ^ 0xffU) & 1) != 0) {
        ppIVar5 = __gnu_cxx::
                  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
                  operator*(&__end2);
        pIStack_e8 = *ppIVar5;
        __range2_1._7_1_ = Item::id(pIStack_e8);
        sVar6 = std::
                map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                ::count((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                         *)&__range2,(key_type_conflict *)((long)&__range2_1 + 7));
        if (sVar6 == 0) {
          __range2_1._6_1_ = Item::id(pIStack_e8);
          pmVar7 = std::
                   map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                   ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                                 *)&__range2,(key_type_conflict *)((long)&__range2_1 + 6));
          *pmVar7 = 0;
        }
        __range2_1._5_1_ = Item::id(pIStack_e8);
        pmVar7 = std::
                 map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                 ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                               *)&__range2,(key_type_conflict *)((long)&__range2_1 + 5));
        *pmVar7 = *pmVar7 + 1;
        __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
        operator++(&__end2);
      }
      __range2_1._4_1_ = 1;
      __end2_1 = std::
                 map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                 ::begin((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                          *)&__range2);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
           ::end((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                  *)&__range2);
      while (bVar2 = std::operator==(&__end2_1,&local_108), ((bVar2 ^ 0xffU) & 1) != 0) {
        item_id = &std::_Rb_tree_iterator<std::pair<const_unsigned_char,_unsigned_short>_>::
                   operator*(&__end2_1)->first;
        quantity_to_place =
             (type_conflict3 *)
             std::get<0ul,unsigned_char_const,unsigned_short>
                       ((pair<const_unsigned_char,_unsigned_short> *)item_id);
        ptStack_120 = std::get<1ul,unsigned_char_const,unsigned_short>
                                ((pair<const_unsigned_char,_unsigned_short> *)item_id);
        pmVar7 = std::
                 map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                 ::operator[](&this->_item_pool_quantities,(key_type_conflict *)quantity_to_place);
        if (*pmVar7 < *ptStack_120) {
          __range2_1._4_1_ = 0;
          break;
        }
        std::_Rb_tree_iterator<std::pair<const_unsigned_char,_unsigned_short>_>::operator++
                  (&__end2_1);
      }
      if ((__range2_1._4_1_ & 1) != 0) {
        for (debug_log._4_4_ = 0; iVar1 = debug_log._4_4_, uVar3 = WorldPath::weight(local_58),
            iVar1 < (int)(uint)uVar3; debug_log._4_4_ = debug_log._4_4_ + 1) {
          std::vector<WorldPath*,std::allocator<WorldPath*>>::emplace_back<WorldPath*&>
                    ((vector<WorldPath*,std::allocator<WorldPath*>> *)&__range1,&local_58);
        }
        local_130 = WorldSolver::debug_log_for_current_step_abi_cxx11_(&this->_solver);
        this_02 = nlohmann::
                  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_130,"blockedPaths");
        pWVar8 = WorldPath::origin(local_58);
        psVar9 = WorldNode::id_abi_cxx11_(pWVar8);
        std::operator+(&local_170,psVar9," --> ");
        pWVar8 = WorldPath::destination(local_58);
        psVar9 = WorldNode::id_abi_cxx11_(pWVar8);
        std::operator+(&local_150,&local_170,psVar9);
        nlohmann::
        basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::emplace_back<std::__cxx11::string>
                  ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)this_02,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
      }
      std::
      map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
      ::~map((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
              *)&__range2);
      std::vector<Item_*,_std::allocator<Item_*>_>::~vector
                ((vector<Item_*,_std::allocator<Item_*>_> *)
                 &quantities_to_place._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    __gnu_cxx::
    __normal_iterator<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

std::vector<WorldPath*> WorldShuffler::build_weighted_blocked_paths_list()
{
    const std::vector<WorldPath*>& blocked_paths = _solver.blocked_paths();
    std::vector<WorldPath*> weighted_blocked_paths;

    for (WorldPath* path : blocked_paths)
    {
        // If items are not the (only) blocking point for taking this path, let it go
        if(!_solver.missing_nodes_to_take_path(path).empty())
            continue;

        // If all items cannot be placed since the item pool is running out of that item type,
        // do not try to open this path. It will open by itself once the item (as placed inside plando)
        // will be reached.
        std::vector<Item*> items_to_place = _solver.missing_items_to_take_path(path);
        std::map<uint8_t, uint16_t> quantities_to_place;
        for(Item* item : items_to_place)
        {
            if(!quantities_to_place.count(item->id()))
                quantities_to_place[item->id()] = 0;
            quantities_to_place[item->id()] += 1;
        }

        bool can_place_all_items = true;
        for(auto& [item_id, quantity_to_place] : quantities_to_place)
        {
            if(_item_pool_quantities[item_id] < quantity_to_place)
            {
                can_place_all_items = false;
                break;
            }
        }

        if(can_place_all_items)
        {
            for(int i=0 ; i<path->weight() ; ++i)
                weighted_blocked_paths.emplace_back(path);

            // All conditions are met, add this path to the weighted blocked paths list
            Json& debug_log = _solver.debug_log_for_current_step();
            debug_log["blockedPaths"].emplace_back(path->origin()->id() + " --> " + path->destination()->id());
        }
    }

    vectools::shuffle(weighted_blocked_paths, _rng);
    return std::move(weighted_blocked_paths);
}